

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

string * absolutename(string *__return_storage_ptr__,string *filename)

{
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (*(filename->_M_dataplus)._M_p == '/') {
    std::__cxx11::string::string((string *)__return_storage_ptr__,filename);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter",&local_59
              );
    std::operator+(&local_58,&local_38,"/");
    std::operator+(__return_storage_ptr__,&local_58,filename);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string absolutename(const std::string & filename)
{
  if (filename[0] == '/') {
    return filename;
  }
  return std::string(RESOURCE_DIR) + "/" + filename;
}